

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O1

void __thiscall Glucose::ClausesBuffer::setNbThreads(ClausesBuffer *this,int _nbThreads)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = this->fifoSizeByCore * _nbThreads;
  uVar1 = uVar3 - 1;
  this->last = uVar1;
  this->maxsize = uVar3;
  this->nbThreads = _nbThreads;
  vec<unsigned_int>::growTo(&this->lastOfThread,_nbThreads);
  if (0 < this->nbThreads) {
    puVar2 = (this->lastOfThread).data;
    lVar4 = 0;
    do {
      puVar2[lVar4] = uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->nbThreads);
  }
  vec<unsigned_int>::growTo(&this->elems,this->maxsize);
  return;
}

Assistant:

void ClausesBuffer::setNbThreads(int _nbThreads) {
    unsigned int _maxsize = fifoSizeByCore*_nbThreads;
    last = _maxsize -1;
    maxsize = _maxsize;
    nbThreads = _nbThreads;
    lastOfThread.growTo(_nbThreads);
    for(int i=0;i<nbThreads;i++) lastOfThread[i] = _maxsize-1;
    elems.growTo(maxsize);
}